

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilTruth.c
# Opt level: O3

void Extra_TruthStretch(uint *pOut,uint *pIn,int nVars,int nVarsAll,uint Phase)

{
  uint uVar1;
  bool bVar2;
  uint *puVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  int iVar;
  
  if (nVarsAll < 1) {
    uVar5 = 1;
    if (nVars != 0) goto LAB_00497554;
  }
  else {
    iVar7 = nVars + -1;
    uVar4 = 0;
    uVar5 = nVarsAll;
    do {
      uVar1 = uVar5 - 1;
      if ((Phase >> (uVar1 & 0x1f) & 1) != 0) {
        if (iVar7 < (int)uVar1) {
          puVar3 = pIn;
          iVar = iVar7;
          do {
            pIn = pOut;
            pOut = puVar3;
            Extra_TruthSwapAdjacentVars(pIn,pOut,nVarsAll,iVar);
            iVar = iVar + 1;
            puVar3 = pIn;
          } while (iVar < (int)uVar1);
          uVar4 = (uVar4 + uVar1) - iVar7;
        }
        iVar7 = iVar7 + -1;
      }
      bVar2 = 1 < (int)uVar5;
      uVar5 = uVar1;
    } while (bVar2);
    if (iVar7 != -1) {
LAB_00497554:
      __assert_fail("Var == -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilTruth.c"
                    ,0xf9,
                    "void Extra_TruthStretch(unsigned int *, unsigned int *, int, int, unsigned int)"
                   );
    }
    if ((uVar4 & 1) != 0) {
      return;
    }
    uVar5 = 1 << ((char)nVarsAll - 5U & 0x1f);
    if (nVarsAll < 6) {
      uVar5 = 1;
    }
    if ((int)uVar5 < 1) {
      return;
    }
  }
  uVar6 = (ulong)uVar5 + 1;
  do {
    pOut[uVar6 - 2] = pIn[uVar6 - 2];
    uVar6 = uVar6 - 1;
  } while (1 < uVar6);
  return;
}

Assistant:

void Extra_TruthStretch( unsigned * pOut, unsigned * pIn, int nVars, int nVarsAll, unsigned Phase )
{
    unsigned * pTemp;
    int i, k, Var = nVars - 1, Counter = 0;
    for ( i = nVarsAll - 1; i >= 0; i-- )
        if ( Phase & (1 << i) )
        {
            for ( k = Var; k < i; k++ )
            {
                Extra_TruthSwapAdjacentVars( pOut, pIn, nVarsAll, k );
                pTemp = pIn; pIn = pOut; pOut = pTemp;
                Counter++;
            }
            Var--;
        }
    assert( Var == -1 );
    // swap if it was moved an even number of times
    if ( !(Counter & 1) )
        Extra_TruthCopy( pOut, pIn, nVarsAll );
}